

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.cpp
# Opt level: O2

PropertyGuardEntry * __thiscall
ThreadContext::EnsurePropertyGuardEntry
          (ThreadContext *this,PropertyRecord *propertyRecord,bool *foundExistingEntry)

{
  bool bVar1;
  RecyclableData *pRVar2;
  Recycler *alloc;
  PropertyGuardEntry *this_00;
  RecyclerWeakReference<const_Js::PropertyRecord> *weakRef;
  undefined1 local_58 [8];
  TrackAllocData data;
  PropertyGuardEntry *entry;
  
  pRVar2 = Memory::RecyclerRootPtr<ThreadContext::RecyclableData>::operator->(&this->recyclableData)
  ;
  data.line = 0;
  data._36_4_ = 0;
  bVar1 = JsUtil::
          WeaklyReferencedKeyDictionary<const_Js::PropertyRecord,_ThreadContext::PropertyGuardEntry_*,_Js::PropertyRecordPointerComparer,_true>
          ::TryGetValue(&pRVar2->propertyGuards,propertyRecord,(PropertyGuardEntry **)&data.line);
  *foundExistingEntry = bVar1;
  if (!bVar1) {
    local_58 = (undefined1  [8])&PropertyGuardEntry::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_307ca64;
    data.filename._0_4_ = 0xdaa;
    alloc = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_58);
    this_00 = (PropertyGuardEntry *)new<Memory::Recycler>(0x48,alloc,0x37a1d4);
    PropertyGuardEntry::PropertyGuardEntry(this_00,this->recycler);
    data._32_8_ = this_00;
    weakRef = CreatePropertyRecordWeakRef(this,propertyRecord);
    JsUtil::
    WeaklyReferencedKeyDictionary<const_Js::PropertyRecord,_ThreadContext::PropertyGuardEntry_*,_Js::PropertyRecordPointerComparer,_true>
    ::UncheckedInsert(&pRVar2->propertyGuards,weakRef,(PropertyGuardEntry *)data._32_8_);
  }
  return (PropertyGuardEntry *)data._32_8_;
}

Assistant:

ThreadContext::PropertyGuardEntry*
ThreadContext::EnsurePropertyGuardEntry(const Js::PropertyRecord* propertyRecord, bool& foundExistingEntry)
{
    PropertyGuardDictionary &guards = this->recyclableData->propertyGuards;
    PropertyGuardEntry* entry = nullptr;

    foundExistingEntry = guards.TryGetValue(propertyRecord, &entry);
    if (!foundExistingEntry)
    {
        entry = RecyclerNew(GetRecycler(), PropertyGuardEntry, GetRecycler());

        guards.UncheckedAdd(CreatePropertyRecordWeakRef(propertyRecord), entry);
    }

    return entry;
}